

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

string * cmGlobalNinjaMultiGenerator::GetNinjaImplFilename
                   (string *__return_storage_ptr__,string *config)

{
  char *pcVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  size_type local_38;
  pointer local_30;
  size_t local_28;
  char *local_20;
  
  pcVar1 = NINJA_FILE_EXTENSION;
  local_30 = (config->_M_dataplus)._M_p;
  local_38 = config->_M_string_length;
  local_48._M_len = 0x10;
  local_48._M_str = "CMakeFiles/impl-";
  local_28 = strlen(NINJA_FILE_EXTENSION);
  local_20 = pcVar1;
  views._M_len = 3;
  views._M_array = &local_48;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaMultiGenerator::GetNinjaImplFilename(
  const std::string& config)
{
  return cmStrCat("CMakeFiles/impl-", config,
                  cmGlobalNinjaMultiGenerator::NINJA_FILE_EXTENSION);
}